

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O0

void Bac_PtrDumpBoxVerilog(FILE *pFile,Vec_Ptr_t *vBox)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  int local_24;
  int i;
  char *pName;
  Vec_Ptr_t *vBox_local;
  FILE *pFile_local;
  
  pvVar2 = Vec_PtrEntry(vBox,0);
  fprintf((FILE *)pFile,"  %s",pvVar2);
  pvVar2 = Vec_PtrEntry(vBox,1);
  fprintf((FILE *)pFile," %s (",pvVar2);
  for (local_24 = 2; iVar1 = Vec_PtrSize(vBox), local_24 < iVar1; local_24 = local_24 + 2) {
    pvVar2 = Vec_PtrEntry(vBox,local_24);
    pvVar3 = Vec_PtrEntry(vBox,local_24 + 1);
    iVar1 = Vec_PtrSize(vBox);
    pcVar4 = "";
    if (local_24 < iVar1 + -2) {
      pcVar4 = ", ";
    }
    fprintf((FILE *)pFile,".%s(%s)%s",pvVar2,pvVar3,pcVar4);
  }
  fprintf((FILE *)pFile,");\n");
  return;
}

Assistant:

void Bac_PtrDumpBoxVerilog( FILE * pFile, Vec_Ptr_t * vBox )
{
    char * pName; int i;
    fprintf( pFile, "  %s", (char *)Vec_PtrEntry(vBox, 0) );
    fprintf( pFile, " %s (", (char *)Vec_PtrEntry(vBox, 1) ); // write intance name in Verilog
    Vec_PtrForEachEntryStart( char *, vBox, pName, i, 2 )
        fprintf( pFile, ".%s(%s)%s", pName, (char *)Vec_PtrEntry(vBox, i+1), i < Vec_PtrSize(vBox) - 2 ? ", ":"" ), i++;
    fprintf( pFile, ");\n" );
}